

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVarious.hpp
# Opt level: O2

void __thiscall Omega_invoke_Test::TestBody(Omega_invoke_Test *this)

{
  ostream *poVar1;
  char *message;
  AssertHelper AStack_1b8;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  std::__cxx11::string::string((string *)&local_1a0,"yuppi!",(allocator *)&gtest_ar);
  poVar1 = std::operator<<((ostream *)&result,"a=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,6);
  poVar1 = std::operator<<(poVar1,", b=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,7);
  poVar1 = std::operator<<(poVar1,", n=");
  std::operator<<(poVar1,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[19]>
            ((internal *)&gtest_ar,"result.str()","\"a=6, b=7, n=yuppi!\"",&local_1a0,
             (char (*) [19])"a=6, b=7, n=yuppi!");
  std::__cxx11::string::~string((string *)&local_1a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x1d,message);
    testing::internal::AssertHelper::operator=(&AStack_1b8,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
  return;
}

Assistant:

TEST(Omega, invoke)
{
    std::ostringstream result;
    auto function = [&result](int a, int b, std::string const &n)
    {
        result << "a=" << a << ", b=" << b << ", n=" << n;
    };

    auto const t1 = omega::make_list<1, 3>(t);

    omega::invoke(function, t1);
    EXPECT_EQ(result.str(), "a=6, b=7, n=yuppi!");

}